

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

OffsetData * __thiscall
QTimeZone::nextTransition
          (OffsetData *__return_storage_ptr__,QTimeZone *this,QDateTime *afterDateTime)

{
  QTimeZonePrivate *pQVar1;
  bool bVar2;
  qint64 qVar3;
  long in_FS_OFFSET;
  Data local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(this->d).d & 3) == 0) {
    bVar2 = hasTransitions(this);
    if (!bVar2) goto LAB_00316331;
    pQVar1 = (this->d).d;
    qVar3 = QDateTime::toMSecsSinceEpoch(afterDateTime);
    (*pQVar1->_vptr_QTimeZonePrivate[0x11])(&local_50,pQVar1,qVar3);
    QTimeZonePrivate::toOffsetData(__return_storage_ptr__,&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  }
  else {
    if (((int)(this->d).d - 1U & 3) != 0) {
LAB_00316331:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QTimeZonePrivate::invalidOffsetData();
        return __return_storage_ptr__;
      }
      goto LAB_00316392;
    }
    systemTimeZone();
    nextTransition(__return_storage_ptr__,(QTimeZone *)&local_50,afterDateTime);
    ~QTimeZone((QTimeZone *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_00316392:
  __stack_chk_fail();
}

Assistant:

QTimeZone::OffsetData QTimeZone::nextTransition(const QDateTime &afterDateTime) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().nextTransition(afterDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            break;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (hasTransitions()) {
        return QTimeZonePrivate::toOffsetData(d->nextTransition(afterDateTime.toMSecsSinceEpoch()));
    }

    return QTimeZonePrivate::invalidOffsetData();
}